

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O0

void ra_remove_at_index(roaring_array_t *ra,int32_t i)

{
  int in_ESI;
  int *in_RDI;
  
  memmove((void *)(*(long *)(in_RDI + 2) + (long)in_ESI * 8),
          (void *)(*(long *)(in_RDI + 2) + (long)(in_ESI + 1) * 8),
          (long)((*in_RDI - in_ESI) + -1) << 3);
  memmove((void *)(*(long *)(in_RDI + 4) + (long)in_ESI * 2),
          (void *)(*(long *)(in_RDI + 4) + (long)(in_ESI + 1) * 2),
          (long)((*in_RDI - in_ESI) + -1) << 1);
  memmove((void *)(*(long *)(in_RDI + 6) + (long)in_ESI),
          (void *)(*(long *)(in_RDI + 6) + (long)(in_ESI + 1)),(long)((*in_RDI - in_ESI) + -1));
  *in_RDI = *in_RDI + -1;
  return;
}

Assistant:

void ra_remove_at_index(roaring_array_t *ra, int32_t i) {
    memmove(&(ra->containers[i]), &(ra->containers[i + 1]),
            sizeof(container_t *) * (ra->size - i - 1));
    memmove(&(ra->keys[i]), &(ra->keys[i + 1]),
            sizeof(uint16_t) * (ra->size - i - 1));
    memmove(&(ra->typecodes[i]), &(ra->typecodes[i + 1]),
            sizeof(uint8_t) * (ra->size - i - 1));
    ra->size--;
}